

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::RgbaInputFile::FromYca::readPixels(FromYca *this,int scanLine1,int scanLine2)

{
  int *piVar1;
  long in_RDI;
  int y_1;
  int y;
  int maxY;
  int minY;
  int in_stack_000001ec;
  FromYca *in_stack_000001f0;
  int local_20;
  int local_1c;
  int local_10;
  int local_c [3];
  
  piVar1 = std::min<int>(local_c,&local_10);
  local_1c = *piVar1;
  piVar1 = std::max<int>(local_c,&local_10);
  local_20 = *piVar1;
  if (*(int *)(in_RDI + 0x4c) == 0) {
    for (; local_1c <= local_20; local_1c = local_1c + 1) {
      readPixels(in_stack_000001f0,in_stack_000001ec);
    }
  }
  else {
    for (; local_1c <= local_20; local_20 = local_20 + -1) {
      readPixels(in_stack_000001f0,in_stack_000001ec);
    }
  }
  return;
}

Assistant:

void
RgbaInputFile::FromYca::readPixels (int scanLine1, int scanLine2)
{
    int minY = min (scanLine1, scanLine2);
    int maxY = max (scanLine1, scanLine2);

    if (_lineOrder == INCREASING_Y)
    {
        for (int y = minY; y <= maxY; ++y)
            readPixels (y);
    }
    else
    {
        for (int y = maxY; y >= minY; --y)
            readPixels (y);
    }
}